

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O2

int lyb_print_data(lyout *out,lyd_node *root,int options)

{
  ly_ctx *ctx;
  lys_submodule *plVar1;
  size_t sVar2;
  lys_module **__ptr;
  int iVar3;
  uint uVar4;
  int iVar5;
  lys_module *plVar6;
  lys_node *plVar7;
  lys_module *plVar8;
  ulong uVar9;
  ulong uVar10;
  lyd_node *plVar11;
  long lVar12;
  long lVar13;
  undefined1 auStack_c8 [8];
  lyb_state lybs;
  hash_table *local_78;
  hash_table *top_sibling_ht;
  size_t local_68;
  size_t mod_count;
  lys_module **local_58;
  lyout *local_50;
  uint32_t local_44;
  lys_module **pplStack_40;
  uint32_t idx;
  uint8_t byte;
  uint8_t local_31 [8];
  uint8_t zero;
  
  local_31[0] = '\0';
  local_78 = (hash_table *)0x0;
  lybs.mod_count = 0;
  lybs._44_4_ = 0;
  lybs.ctx = (ly_ctx *)0x0;
  lybs.used = 0;
  lybs.size = 0;
  lybs.models = (lys_module **)0x0;
  lybs.position = (size_t *)0x0;
  lybs.inner_chunks = (uint8_t *)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  lybs.written = (size_t *)0x0;
  lybs.sib_ht = (anon_struct_16_2_515384b0 *)0x0;
  top_sibling_ht._4_4_ = options;
  if (root != (lyd_node *)0x0) {
    plVar6 = lyd_node_module(root);
    ctx = plVar6->ctx;
    plVar7 = root->schema;
    lybs._40_8_ = ctx;
    do {
      plVar7 = lys_parent(plVar7);
      if (plVar7 == (lys_node *)0x0) goto LAB_001914c3;
    } while (plVar7->nodetype == LYS_USES);
    if (plVar7->nodetype != LYS_EXT) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,"LYB printer supports only printing top-level nodes.");
      return 1;
    }
  }
LAB_001914c3:
  pplStack_40 = (lys_module **)CONCAT53(pplStack_40._3_5_,0x62796c);
  iVar3 = ly_write(out,(char *)&stack0xffffffffffffffc0,3);
  _byte = 1;
  if (-1 < iVar3) {
    pplStack_40 = (lys_module **)((ulong)pplStack_40 & 0xffffffffffffff00);
    iVar3 = ly_write(out,(char *)&stack0xffffffffffffffc0,1);
    if (-1 < iVar3) {
      pplStack_40 = (lys_module **)0x0;
      local_68 = 0;
      local_44 = 0;
      local_50 = out;
      for (plVar11 = root; plVar11 != (lyd_node *)0x0; plVar11 = plVar11->next) {
        plVar6 = lyd_node_module(plVar11);
        add_model(&stack0xffffffffffffffc0,&local_68,plVar6);
      }
      mod_count = (size_t)root;
      if (root != (lyd_node *)0x0) {
        local_44 = ly_ctx_internal_modules_count(root->schema->module->ctx);
LAB_00191562:
        while (plVar6 = ly_ctx_get_module_iter(root->schema->module->ctx,&local_44),
              sVar2 = local_68, plVar6 != (lys_module *)0x0) {
          if ((plVar6->field_0x40 & 0x80) != 0) {
            local_58 = pplStack_40;
            lVar12 = 0x18;
            for (uVar10 = 0; uVar10 < plVar6->deviation_size; uVar10 = uVar10 + 1) {
              plVar7 = *(lys_node **)((long)&plVar6->deviation->target_name + lVar12);
              if (plVar7 != (lys_node *)0x0) {
                plVar8 = lys_node_module(plVar7);
                iVar3 = is_added_model(local_58,sVar2,plVar8);
                if (iVar3 != 0) goto LAB_00191611;
              }
              lVar12 = lVar12 + 0x38;
            }
            uVar10 = 0xffffffffffffffff;
            lVar12 = 0x58;
            while (uVar10 = uVar10 + 1, uVar10 < plVar6->augment_size) {
              lVar13 = lVar12 + -0x1c;
              lVar12 = lVar12 + 0x68;
              plVar8 = lys_node_module(*(lys_node **)(plVar6->augment->padding + lVar13));
              iVar3 = is_added_model(local_58,sVar2,plVar8);
              if (iVar3 != 0) goto LAB_00191611;
            }
            uVar10 = 0;
            while (root = (lyd_node *)mod_count, uVar10 < plVar6->inc_size) {
              plVar1 = plVar6->inc[uVar10].submodule;
              lVar12 = 0x18;
              lybs._64_8_ = uVar10;
              for (uVar9 = 0; uVar9 < plVar1->deviation_size; uVar9 = uVar9 + 1) {
                plVar7 = *(lys_node **)((long)&plVar1->deviation->target_name + lVar12);
                if (plVar7 != (lys_node *)0x0) {
                  plVar8 = lys_node_module(plVar7);
                  iVar3 = is_added_model(local_58,sVar2,plVar8);
                  if (iVar3 != 0) goto LAB_00191611;
                }
                lVar12 = lVar12 + 0x38;
              }
              uVar10 = 0xffffffffffffffff;
              lVar12 = 0x58;
              while (uVar10 = uVar10 + 1, uVar10 < plVar1->augment_size) {
                lVar13 = lVar12 + -0x1c;
                lVar12 = lVar12 + 0x68;
                plVar8 = lys_node_module(*(lys_node **)(plVar1->augment->padding + lVar13));
                iVar3 = is_added_model(local_58,sVar2,plVar8);
                if (iVar3 != 0) goto LAB_00191611;
              }
              uVar10 = lybs._64_8_ + 1;
            }
          }
        }
      }
      sVar2 = local_68;
      iVar3 = lyb_write_number(local_68,2,local_50,(lyb_state *)auStack_c8);
      __ptr = pplStack_40;
      for (uVar4 = 0; uVar4 < sVar2; uVar4 = uVar4 + 1) {
        iVar5 = lyb_print_model(local_50,__ptr[uVar4],(lyb_state *)auStack_c8);
        iVar3 = iVar3 + iVar5;
      }
      free(__ptr);
      if (-1 < iVar3) {
        plVar6 = (lys_module *)0x0;
        for (plVar11 = (lyd_node *)mod_count; plVar11 != (lyd_node *)0x0; plVar11 = plVar11->next) {
          plVar8 = lyd_node_module(plVar11);
          if (plVar8 != plVar6) {
            local_78 = (hash_table *)0x0;
            plVar6 = lyd_node_module(plVar11);
          }
          iVar3 = lyb_print_subtree(local_50,plVar11,&local_78,(lyb_state *)auStack_c8,1);
          if (iVar3 < 0) {
            _byte = 1;
            goto LAB_001917cd;
          }
          if ((top_sibling_ht._4_4_ & 1) == 0) break;
        }
        _byte = lyb_write(local_50,local_31,1,(lyb_state *)auStack_c8);
        _byte = _byte >> 0x1f;
      }
    }
  }
LAB_001917cd:
  free((void *)auStack_c8);
  free(lybs.written);
  free(lybs.position);
  lVar12 = 8;
  for (lVar13 = 0; lVar13 < (int)lybs.sib_ht; lVar13 = lVar13 + 1) {
    lyht_free(*(hash_table **)((long)&((lybs.ctx)->dict).hash_tab + lVar12));
    lVar12 = lVar12 + 0x10;
  }
  free(lybs.ctx);
  return _byte;
LAB_00191611:
  add_model(&stack0xffffffffffffffc0,&local_68,plVar6);
  root = (lyd_node *)mod_count;
  goto LAB_00191562;
}

Assistant:

int
lyb_print_data(struct lyout *out, const struct lyd_node *root, int options)
{
    int r, ret = 0, rc = EXIT_SUCCESS;
    uint8_t zero = 0;
    struct hash_table *top_sibling_ht = NULL;
    const struct lys_module *prev_mod = NULL;
    struct lys_node *parent;
    struct lyb_state lybs;

    memset(&lybs, 0, sizeof lybs);

    if (root) {
        lybs.ctx = lyd_node_module(root)->ctx;

        for (parent = lys_parent(root->schema); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
        if (parent && (parent->nodetype != LYS_EXT)) {
            LOGERR(lybs.ctx, LY_EINVAL, "LYB printer supports only printing top-level nodes.");
            return EXIT_FAILURE;
        }
    }

    /* LYB magic number */
    ret += (r = lyb_print_magic_number(out));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    /* LYB header */
    ret += (r = lyb_print_header(out));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    /* all used models */
    ret += (r = lyb_print_data_models(out, root, &lybs));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    LY_TREE_FOR(root, root) {
        /* do not reuse sibling hash tables from different modules */
        if (lyd_node_module(root) != prev_mod) {
            top_sibling_ht = NULL;
            prev_mod = lyd_node_module(root);
        }

        ret += (r = lyb_print_subtree(out, root, &top_sibling_ht, &lybs, 1));
        if (r < 0) {
            rc = EXIT_FAILURE;
            goto finish;
        }

        if (!(options & LYP_WITHSIBLINGS)) {
            break;
        }
    }

    /* ending zero byte */
    ret += (r = lyb_write(out, &zero, sizeof zero, &lybs));
    if (r < 0) {
        rc = EXIT_FAILURE;
    }

finish:
    free(lybs.written);
    free(lybs.position);
    free(lybs.inner_chunks);
    for (r = 0; r < lybs.sib_ht_count; ++r) {
        lyht_free(lybs.sib_ht[r].ht);
    }
    free(lybs.sib_ht);

    return rc;
}